

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O0

ostream * test_detail::print_tuple_impl<std::tuple<int,int>,0ul,1ul>(ostream *stream,size_type t)

{
  __tuple_element_t<0UL,_tuple<int,_int>_> *p_Var1;
  ostream *this;
  __tuple_element_t<1UL,_tuple<int,_int>_> *p_Var2;
  undefined4 local_34;
  undefined4 *local_30;
  initializer_list<int> x;
  tuple<int,_int> *t_local;
  ostream *stream_local;
  
  x._M_len = t;
  std::operator<<(stream,"(");
  p_Var1 = std::get<0ul,int,int>((tuple<int,_int> *)x._M_len);
  std::ostream::operator<<(stream,*p_Var1);
  this = std::operator<<(stream,", ");
  p_Var2 = std::get<1ul,int,int>((tuple<int,_int> *)x._M_len);
  std::ostream::operator<<(this,*p_Var2);
  local_34 = 0;
  local_30 = &local_34;
  x._M_array = (iterator)0x1;
  std::operator<<(stream,")");
  return stream;
}

Assistant:

std::ostream & print_tuple_impl (std::ostream & stream, const Tuple & t, std::index_sequence<Head, Tail...>)
    {
        stream << "(";
        stream << std::get<Head>(t);
        auto x = {(stream << ", " << std::get<Tail>(t), 0)...};
        static_cast<void>(x);
        stream << ")";

        return stream;
    }